

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O0

Gia_Man_t * Gia_ManCleanupOutputs(Gia_Man_t *p,int nOutputs)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  bool bVar3;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  int nOutputs_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScl.c"
                  ,0x69,"Gia_Man_t *Gia_ManCleanupOutputs(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ManCoNum(p);
  if (nOutputs < iVar1) {
    Gia_ManCombMarkUsed(p);
    local_24 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar3 = false;
      if (local_24 < iVar1) {
        pGStack_20 = Gia_ManCo(p,local_24);
        bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
      if ((!bVar3) || (nOutputs <= local_24)) break;
      *(ulong *)pGStack_20 = *(ulong *)pGStack_20 & 0xffffffffbfffffff | 0x40000000;
      local_24 = local_24 + 1;
    }
    pGVar2 = Gia_ManDupMarked(p);
    return pGVar2;
  }
  __assert_fail("nOutputs < Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScl.c"
                ,0x6a,"Gia_Man_t *Gia_ManCleanupOutputs(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManCleanupOutputs( Gia_Man_t * p, int nOutputs )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    assert( nOutputs < Gia_ManCoNum(p) );
    Gia_ManCombMarkUsed( p );
    Gia_ManForEachCo( p, pObj, i )
        if ( i < nOutputs )
            pObj->fMark0 = 1;
        else
            break;
    return Gia_ManDupMarked( p );
}